

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_bld.cpp
# Opt level: O3

void ucnv_shareConverterData(UConverterSharedData *data)

{
  UHashtable *hash;
  uint16_t uVar1;
  uint in_EAX;
  UErrorCode err;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  if (SHARED_DATA_HASHTABLE == (UHashtable *)0x0) {
    uVar1 = ucnv_io_countKnownConverters_63((UErrorCode *)((long)&uStack_18 + 4));
    SHARED_DATA_HASHTABLE =
         uhash_openSize_63(uhash_hashChars_63,uhash_compareChars_63,(undefined1 *)0x0,
                           (uint)uVar1 * 2,(UErrorCode *)((long)&uStack_18 + 4));
    ucln_common_registerCleanup_63(UCLN_COMMON_UCNV,ucnv_cleanup);
    if (0 < uStack_18._4_4_) {
      return;
    }
  }
  hash = SHARED_DATA_HASHTABLE;
  data->sharedDataCached = '\x01';
  uhash_put_63(hash,data->staticData->name,data,(UErrorCode *)((long)&uStack_18 + 4));
  return;
}

Assistant:

static void
ucnv_shareConverterData(UConverterSharedData * data)
{
    UErrorCode err = U_ZERO_ERROR;
    /*Lazy evaluates the Hashtable itself */
    /*void *sanity = NULL;*/

    if (SHARED_DATA_HASHTABLE == NULL)
    {
        SHARED_DATA_HASHTABLE = uhash_openSize(uhash_hashChars, uhash_compareChars, NULL,
                            ucnv_io_countKnownConverters(&err)*UCNV_CACHE_LOAD_FACTOR,
                            &err);
        ucnv_enableCleanup();

        if (U_FAILURE(err))
            return;
    }

    /* ### check to see if the element is not already there! */

    /*
    sanity =   ucnv_getSharedConverterData (data->staticData->name);
    if(sanity != NULL)
    {
    UCNV_DEBUG_LOG("put:overwrite!",data->staticData->name,sanity);
    }
    UCNV_DEBUG_LOG("put:chk",data->staticData->name,sanity);
    */

    /* Mark it shared */
    data->sharedDataCached = TRUE;

    uhash_put(SHARED_DATA_HASHTABLE,
            (void*) data->staticData->name, /* Okay to cast away const as long as
            keyDeleter == NULL */
            data,
            &err);
    UCNV_DEBUG_LOG("put", data->staticData->name,data);

}